

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TexSubImage2DEmptyTexCase::createTexture(TexSubImage2DEmptyTexCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  deUint32 type;
  deUint32 dVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int height;
  int ndx;
  long lVar7;
  float fVar8;
  deUint32 tex;
  ContextWrapper *local_c8;
  ulong local_c0;
  Vec4 gMax;
  Vec4 gMin;
  Random rnd;
  TextureLevel data;
  PixelBufferAccess local_58;
  
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&(this->super_Texture2DSpecCase).m_texFormat);
  dVar3 = deStringHash((this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar3);
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  local_c8 = this_00;
  if (0 < (this->super_Texture2DSpecCase).m_numLevels) {
    iVar5 = 0;
    do {
      iVar6 = (this->super_Texture2DSpecCase).m_width >> ((byte)iVar5 & 0x1f);
      if (iVar6 < 2) {
        iVar6 = 1;
      }
      height = (this->super_Texture2DSpecCase).m_height >> ((byte)iVar5 & 0x1f);
      if (height < 2) {
        height = 1;
      }
      sglr::ContextWrapper::glTexImage2D
                (this_00,0xde1,iVar5,*(int *)&(this->super_Texture2DSpecCase).field_0xd4,iVar6,
                 height,0,this->m_format,this->m_dataType,(void *)0x0);
      iVar5 = iVar5 + 1;
      iVar6 = (this->super_Texture2DSpecCase).m_numLevels;
    } while (iVar5 < iVar6);
    if (0 < iVar6) {
      iVar5 = 0;
      do {
        iVar6 = (this->super_Texture2DSpecCase).m_width >> ((byte)iVar5 & 0x1f);
        if (iVar6 < 2) {
          iVar6 = 1;
        }
        uVar4 = (this->super_Texture2DSpecCase).m_height >> ((byte)iVar5 & 0x1f);
        if ((int)uVar4 < 2) {
          uVar4 = 1;
        }
        local_c0 = (ulong)uVar4;
        gMin.m_data[0] = 0.0;
        gMin.m_data[1] = 0.0;
        gMin.m_data[2] = 0.0;
        gMin.m_data[3] = 0.0;
        lVar7 = 0;
        do {
          fVar1 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[lVar7];
          fVar2 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[lVar7];
          fVar8 = deRandom_getFloat(&rnd.m_rnd);
          gMin.m_data[lVar7] = (fVar2 - fVar1) * fVar8 + fVar1;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        gMax.m_data[0] = 0.0;
        gMax.m_data[1] = 0.0;
        gMax.m_data[2] = 0.0;
        gMax.m_data[3] = 0.0;
        lVar7 = 0;
        do {
          fVar1 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[lVar7];
          fVar2 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[lVar7];
          fVar8 = deRandom_getFloat(&rnd.m_rnd);
          gMax.m_data[lVar7] = (fVar2 - fVar1) * fVar8 + fVar1;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        tcu::TextureLevel::setSize(&data,iVar6,(int)local_c0,1);
        tcu::TextureLevel::getAccess(&local_58,&data);
        tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
        dVar3 = this->m_format;
        type = this->m_dataType;
        tcu::TextureLevel::getAccess(&local_58,&data);
        sglr::ContextWrapper::glTexSubImage2D
                  (local_c8,0xde1,iVar5,0,0,iVar6,(int)local_c0,dVar3,type,
                   local_58.super_ConstPixelBufferAccess.m_data);
        iVar5 = iVar5 + 1;
      } while (iVar5 < (this->super_Texture2DSpecCase).m_numLevels);
    }
  }
  tcu::TextureLevel::~TextureLevel(&data);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(m_texFormat);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// First allocate storage for each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, levelW, levelH, 0, m_format, m_dataType, DE_NULL);
		}

		// Specify pixel data to all levels using glTexSubImage2D()
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			data.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

			glTexSubImage2D(GL_TEXTURE_2D, ndx, 0, 0, levelW, levelH, m_format, m_dataType, data.getAccess().getDataPtr());
		}
	}